

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall
CLI::TypeValidator<double>::TypeValidator(TypeValidator<double> *this,string *validator_name)

{
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)validator_name);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:254:37)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:254:37)>
             ::_M_manager;
  Validator::Validator
            (&this->super_Validator,&local_30,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit TypeValidator(const std::string &validator_name)
        : Validator(validator_name, [](std::string &input_string) {
              using CLI::detail::lexical_cast;
              auto val = DesiredType();
              if(!lexical_cast(input_string, val)) {
                  return std::string("Failed parsing ") + input_string + " as a " + detail::type_name<DesiredType>();
              }
              return std::string();
          }) {}